

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

void RecDblWrd(GmfMshSct *msh,void *wrd)

{
  size_t sVar1;
  
  sVar1 = fwrite(wrd,4,2,(FILE *)msh->hdl);
  if (sVar1 == 2) {
    return;
  }
  longjmp((__jmp_buf_tag *)msh->err,-0x1d);
}

Assistant:

static void RecDblWrd(GmfMshSct *msh, const void *wrd)
{
   // [Bruno] added error control
#ifdef WITH_GMF_AIO
   if(write(msh->FilDes, wrd, WrdSiz * 2) != WrdSiz*2)
#else
   if(fwrite(wrd, WrdSiz, 2, msh->hdl) != 2)
#endif
      longjmp(msh->err,-29);
}